

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

MaterialHandle __thiscall
pbrt::MixMaterial::ChooseMaterial<pbrt::UniversalTextureEvaluator>
          (MixMaterial *this,undefined8 *param_2)

{
  undefined1 auVar1 [16];
  Point3<float> args;
  TextureEvalContext ctx;
  uint64_t uVar2;
  uintptr_t uVar3;
  uintptr_t *puVar4;
  undefined1 in_XMM4 [16];
  undefined8 in_stack_00000008;
  float fStack0000000000000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined1 in_stack_00000048 [12];
  UniversalTextureEvaluator local_35;
  float local_34;
  MaterialHandle local_30;
  MaterialHandle local_28;
  undefined8 local_20;
  
  local_20 = *param_2;
  ctx._8_8_ = _fStack0000000000000010;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_00000008;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_00000018;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_00000020;
  ctx._32_8_ = in_stack_00000028;
  ctx._40_8_ = in_stack_00000030;
  ctx._48_8_ = in_stack_00000038;
  ctx._56_8_ = in_stack_00000040;
  local_34 = UniversalTextureEvaluator::operator()(&local_35,(FloatTextureHandle)&local_20,ctx);
  if (local_34 <= 0.0) {
    uVar3 = param_2[1];
  }
  else if (1.0 <= local_34) {
    uVar3 = param_2[2];
  }
  else {
    local_28.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
             )param_2[1];
    args.super_Tuple3<pbrt::Point3,_float>.z = fStack0000000000000010;
    args.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_00000008;
    local_30.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
             )param_2[2];
    uVar2 = Hash<pbrt::Point3<float>,pbrt::Vector3<float>,pbrt::MaterialHandle,pbrt::MaterialHandle>
                      (args,(Vector3<float>)in_stack_00000048,&local_28,&local_30);
    auVar1 = vcvtusi2sd_avx512f(in_XMM4,(int)uVar2);
    puVar4 = param_2 + 2;
    if (local_34 < (float)(auVar1._0_8_ * 2.3283064365386963e-10)) {
      puVar4 = param_2 + 1;
    }
    uVar3 = *puVar4;
  }
  (this->amount).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = uVar3;
  return (MaterialHandle)
         (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          )this;
}

Assistant:

PBRT_CPU_GPU MaterialHandle ChooseMaterial(TextureEvaluator texEval,
                                               MaterialEvalContext ctx) const {
        Float amt = texEval(amount, ctx);
        if (amt <= 0)
            return materials[0];
        if (amt >= 1)
            return materials[1];

        Float u = uint32_t(Hash(ctx.p, ctx.wo, materials[0], materials[1])) * 0x1p-32;
        return (amt < u) ? materials[0] : materials[1];
    }